

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void simd::Flip(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,bool horizontal,bool vertical,
               SIMDType simdType)

{
  uint32_t rowSizeIn;
  SIMDType simdType_00;
  uint32_t uVar1;
  uint uVar2;
  ImageTemplate<unsigned_char> local_58;
  
  do {
    do {
      simdType_00 = simdType;
      simdType = sse_function;
    } while (simdType_00 == avx_function);
    if (simdType_00 == cpu_function) break;
    uVar1 = getSimdSize(simdType_00);
    uVar2 = uVar1;
    if (simdType_00 == neon_function) {
      uVar2 = 8;
    }
    if (uVar2 <= width) {
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
      Image_Function::
      VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (in,&local_58);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
      if (horizontal || vertical) {
        if (simdType_00 == sse_function) {
          rowSizeIn = in->_rowSize;
          sse::Flip(out,startXOut,startYOut,width,height,rowSizeIn,out->_rowSize,
                    in->_data + (ulong)startXIn + (ulong)(startYIn * rowSizeIn),
                    in->_data + (ulong)startXIn + (ulong)(startYIn * rowSizeIn) + rowSizeIn * height
                    ,horizontal,vertical,width / uVar1,uVar1 * (width / uVar1),width % uVar1);
        }
      }
      else {
        Image_Function::Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
      }
      return;
    }
  } while (simdType_00 == avx_function);
  Image_Function::Flip
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height,horizontal,vertical);
  return;
}

Assistant:

void Flip( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height, bool horizontal, bool vertical, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );

        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;

        if( (simdType == cpu_function) || (simdType == avx_function) || (width < simdSize) ) {
            AVX_CODE( Flip( in, startXIn, startYIn, out, startXOut, startYOut, width, height, horizontal, vertical, sse_function ); )

            Image_Function::Flip( in, startXIn, startYIn, out, startXOut, startYOut, width, height, horizontal, vertical );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        if( !horizontal && !vertical ) {
            Image_Function::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const uint32_t rowSizeIn  = in.rowSize();
            const uint32_t rowSizeOut = out.rowSize();

            const uint8_t * inY    = in.data() + startYIn * rowSizeIn + startXIn;
            const uint8_t * inYEnd = inY + height * rowSizeIn;

            const uint32_t simdWidth = width / simdSize;
            const uint32_t totalSimdWidth = simdWidth * simdSize;
            const uint32_t nonSimdWidth = width - totalSimdWidth;

            SSSE3_CODE( sse::Flip( out, startXOut, startYOut, width, height, rowSizeIn, rowSizeOut, inY, inYEnd, horizontal, 
                                   vertical, simdWidth, totalSimdWidth, nonSimdWidth ); )
            NEON_CODE( neon::Flip( out, startXOut, startYOut, width, height, rowSizeIn, rowSizeOut, inY, inYEnd, horizontal, 
                                   vertical, simdWidth, totalSimdWidth, nonSimdWidth ); )
        }
    }